

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O2

ValueType __thiscall
draco::PointAttribute::DeduplicateFormattedValues<unsigned_short,2>
          (PointAttribute *this,GeometryAttribute *in_att,AttributeValueIndex in_att_offset)

{
  uint uVar1;
  size_t __n;
  pointer pIVar2;
  pointer pIVar3;
  uint uVar4;
  ulong uVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>,_bool>
  pVar6;
  AttributeValue att_value;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  value_map;
  ValueToIndexMap value_to_index_map;
  undefined4 local_8c;
  undefined4 local_88;
  uint local_84;
  _Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  local_80;
  _Hashtable<std::array<unsigned_short,_2UL>,_std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::array<unsigned_short,_2UL>_>,_draco::HashArray<std::array<unsigned_short,_2UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  ::IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                     *)&local_80,(ulong)this->num_unique_entries_);
  uVar5 = 0;
  uVar4 = 0;
  while( true ) {
    uVar1 = this->num_unique_entries_;
    if (uVar1 <= uVar5) break;
    local_8c = *(undefined4 *)
                ((in_att->buffer_->data_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start +
                (ulong)((int)uVar5 + in_att_offset.value_) * in_att->byte_stride_ +
                in_att->byte_offset_);
    local_88 = local_8c;
    local_84 = uVar4;
    pVar6 = std::
            _Hashtable<std::array<unsigned_short,2ul>,std::pair<std::array<unsigned_short,2ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,std::allocator<std::pair<std::array<unsigned_short,2ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>,std::__detail::_Select1st,std::equal_to<std::array<unsigned_short,2ul>>,draco::HashArray<std::array<unsigned_short,2ul>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::pair<std::array<unsigned_short,2ul>,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                      ((_Hashtable<std::array<unsigned_short,2ul>,std::pair<std::array<unsigned_short,2ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,std::allocator<std::pair<std::array<unsigned_short,2ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>,std::__detail::_Select1st,std::equal_to<std::array<unsigned_short,2ul>>,draco::HashArray<std::array<unsigned_short,2ul>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&local_68,&local_88);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_80._M_impl.super__Vector_impl_data._M_start[uVar5].value_ =
           *(uint *)((long)pVar6.first.
                           super__Node_iterator_base<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
                           ._M_cur.
                           super__Node_iterator_base<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
                    + 0xc);
    }
    else {
      __n = (this->super_GeometryAttribute).byte_stride_;
      memcpy((void *)(uVar4 * __n +
                     (long)(((this->super_GeometryAttribute).buffer_)->data_).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start),&local_8c,__n);
      local_80._M_impl.super__Vector_impl_data._M_start[uVar5].value_ = uVar4;
      uVar4 = uVar4 + 1;
    }
    uVar5 = uVar5 + 1;
  }
  if (uVar4 != uVar1) {
    if (this->identity_mapping_ == false) {
      pIVar2 = (this->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pIVar3 = (this->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (uVar5 = 0; ((ulong)((long)pIVar3 - (long)pIVar2) >> 2 & 0xffffffff) != uVar5;
          uVar5 = uVar5 + 1) {
        pIVar2[uVar5].value_ =
             local_80._M_impl.super__Vector_impl_data._M_start[pIVar2[uVar5].value_].value_;
      }
    }
    else {
      SetExplicitMapping(this,(ulong)uVar1);
      uVar1 = this->num_unique_entries_;
      pIVar2 = (this->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        pIVar2[uVar5].value_ = local_80._M_impl.super__Vector_impl_data._M_start[uVar5].value_;
      }
    }
    this->num_unique_entries_ = uVar4;
  }
  std::
  _Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
  ::~_Vector_base(&local_80);
  std::
  _Hashtable<std::array<unsigned_short,_2UL>,_std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::array<unsigned_short,_2UL>_>,_draco::HashArray<std::array<unsigned_short,_2UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return uVar4;
}

Assistant:

AttributeValueIndex::ValueType PointAttribute::DeduplicateFormattedValues(
    const GeometryAttribute &in_att, AttributeValueIndex in_att_offset) {
  // We want to detect duplicates using a hash map but we cannot hash floating
  // point numbers directly so bit-copy floats to the same sized integers and
  // hash them.

  // First we need to determine which int type to use (1, 2, 4 or 8 bytes).
  // Note, this is done at compile time using std::conditional struct.
  // Conditional is in form <bool-expression, true, false>. If bool-expression
  // is true the "true" branch is used and vice versa. All at compile time.
  typedef conditional_t<sizeof(T) == 1, uint8_t,
                        conditional_t<sizeof(T) == 2, uint16_t,
                                      conditional_t<sizeof(T) == 4, uint32_t,
                                                    /*else*/ uint64_t>>>
      HashType;

  AttributeValueIndex unique_vals(0);
  typedef std::array<T, num_components_t> AttributeValue;
  typedef std::array<HashType, num_components_t> AttributeHashableValue;
  typedef unordered_map<AttributeHashableValue, AttributeValueIndex,
                        HashArray<AttributeHashableValue>>
      ValueToIndexMap;

  // Hash map storing index of the first attribute with a given value.
  ValueToIndexMap value_to_index_map;
  AttributeValue att_value;
  AttributeHashableValue hashable_value;
  IndexTypeVector<AttributeValueIndex, AttributeValueIndex> value_map(
      num_unique_entries_);
  for (AttributeValueIndex i(0); i < num_unique_entries_; ++i) {
    const AttributeValueIndex att_pos = i + in_att_offset;
    att_value = in_att.GetValue<T, num_components_t>(att_pos);
    // Convert the value to hashable type. Bit-copy real attributes to integers.
    memcpy(&(hashable_value[0]), &(att_value[0]), sizeof(att_value));

    typename ValueToIndexMap::iterator it;
    bool inserted;
    std::tie(it, inserted) = value_to_index_map.insert(
        std::pair<AttributeHashableValue, AttributeValueIndex>(hashable_value,
                                                               unique_vals));

    // Try to update the hash map with a new entry pointing to the latest unique
    // vertex index.
    if (!inserted) {
      // Duplicated value found. Update index mapping.
      value_map[i] = it->second;
    } else {
      // New unique value.
      SetAttributeValue(unique_vals, &att_value);
      // Update index mapping.
      value_map[i] = unique_vals;

      ++unique_vals;
    }
  }
  if (unique_vals == num_unique_entries_) {
    return unique_vals.value();  // Nothing has changed.
  }
  if (is_mapping_identity()) {
    // Change identity mapping to the explicit one.
    // The number of points is equal to the number of old unique values.
    SetExplicitMapping(num_unique_entries_);
    // Update the explicit map.
    for (uint32_t i = 0; i < num_unique_entries_; ++i) {
      SetPointMapEntry(PointIndex(i), value_map[AttributeValueIndex(i)]);
    }
  } else {
    // Update point to value map using the mapping between old and new values.
    for (PointIndex i(0); i < static_cast<uint32_t>(indices_map_.size()); ++i) {
      SetPointMapEntry(i, value_map[indices_map_[i]]);
    }
  }
  num_unique_entries_ = unique_vals.value();
  return num_unique_entries_;
}